

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O1

void __thiscall
Minisat::Int64Option::getNonDefaultString
          (Int64Option *this,int granularity,char *buffer,size_t size)

{
  bool bVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  vector<long,_std::allocator<long>_> values;
  vector<long,_std::allocator<long>_> local_48;
  
  if (granularity == 0) {
    lVar3 = (this->range).begin;
    lVar4 = (this->range).end;
    if ((lVar4 - lVar3) - 2U < 0xf && lVar3 <= lVar4) {
      do {
        if (lVar3 != this->defaultValue) {
          snprintf(buffer,size,"%ld",lVar3);
          sVar2 = strlen(buffer);
          size = ~sVar2 + size;
          if ((lVar3 != (this->range).end) && (lVar3 + 1 != this->defaultValue)) {
            buffer[(int)sVar2] = ',';
            lVar4 = (long)((sVar2 << 0x20) + 0x100000000) >> 0x20;
            buffer[lVar4] = '\0';
            buffer = buffer + lVar4;
          }
        }
        bVar1 = lVar3 < (this->range).end;
        lVar3 = lVar3 + 1;
      } while (bVar1);
    }
  }
  else {
    local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    fillGranularityDomain(this,granularity,&local_48);
    if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      uVar5 = 0;
      do {
        if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
            ._M_start[uVar5] != this->defaultValue) {
          snprintf(buffer,size,"%ld");
          sVar2 = strlen(buffer);
          size = ~sVar2 + size;
          if ((uVar5 + 1 <
               (ulong)((long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3)) &&
             (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar5 + 1] != this->defaultValue)) {
            buffer[(int)sVar2] = ',';
            lVar3 = (long)((sVar2 << 0x20) + 0x100000000) >> 0x20;
            buffer[lVar3] = '\0';
            buffer = buffer + lVar3;
          }
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < (ulong)((long)local_48.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_48.super__Vector_base<long,_std::allocator<long>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

virtual void getNonDefaultString(int granularity, char *buffer, size_t size)
    {
        if (granularity != 0) {
            std::vector<int64_t> values;
            fillGranularityDomain(granularity, values);
            for (size_t i = 0; i < values.size(); ++i) {
                if (values[i] == defaultValue) {
                    continue;
                }                                         // do not print default value
                snprintf(buffer, size, "%ld", values[i]); // convert value
                const int sl = strlen(buffer);
                size = size - strlen(buffer) - 1; // store new size
                if (i + 1 < values.size() && values[i + 1] != defaultValue) {
                    buffer[sl] = ',';           // set separator
                    buffer[sl + 1] = 0;         // indicate end of buffer
                    buffer = &(buffer[sl + 1]); // move start pointer accordingly (len is one more now)
                }
            }
        } else if (range.end - range.begin <= 16 && range.end - range.begin > 1) {
            for (int64_t i = range.begin; i <= range.end; ++i) {
                if (i == defaultValue) {
                    continue;
                }                                 // do not print default value
                snprintf(buffer, size, "%ld", i); // convert value
                const int sl = strlen(buffer);
                size = size - strlen(buffer) - 1; // store new size
                if (i != range.end && i + 1 != defaultValue) {
                    buffer[sl] = ',';           // set separator
                    buffer[sl + 1] = 0;         // indicate end of buffer
                    buffer = &(buffer[sl + 1]); // move start pointer accordingly (len is one more now)
                }
            }
        }
    }